

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O0

void __thiscall
covenant::Solver<covenant::Sym>::Solver
          (Solver<covenant::Sym> *this,CFGProblem *problem_,reg_solver_t *s,Options opts_)

{
  pointer in_RDX;
  CFGProblem *in_RDI;
  undefined8 in_stack_00000008;
  size_t in_stack_00000010;
  size_t in_stack_00000018;
  undefined8 in_stack_00000020;
  CFGProblem *pCVar1;
  CFGProblem *in_stack_ffffffffffffffa0;
  
  pCVar1 = in_RDI;
  CFGProblem::CFGProblem(in_stack_ffffffffffffffa0,in_RDI);
  in_RDI[1].cns.
  super__Vector_base<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
  ._M_impl.super__Vector_impl_data._M_start = in_RDX;
  std::vector<covenant::CFG,_std::allocator<covenant::CFG>_>::vector
            ((vector<covenant::CFG,_std::allocator<covenant::CFG>_> *)0x1ca65c);
  std::
  vector<covenant::CFGDigest<covenant::Sym>,_std::allocator<covenant::CFGDigest<covenant::Sym>_>_>::
  vector((vector<covenant::CFGDigest<covenant::Sym>,_std::allocator<covenant::CFGDigest<covenant::Sym>_>_>
          *)0x1ca66f);
  std::vector<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>::vector
            ((vector<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_> *
             )0x1ca685);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x1ca69b);
  in_RDI[2].var_table.table_.size_ = in_stack_00000018;
  *(undefined8 *)&in_RDI[2].var_table.table_.mlf_ = in_stack_00000020;
  *(undefined8 *)&in_RDI[2].var_table.table_ = in_stack_00000008;
  in_RDI[2].var_table.table_.bucket_count_ = in_stack_00000010;
  std::ofstream::ofstream(&in_RDI[2].var_table.table_.max_load_);
  std::ofstream::ofstream
            (&pCVar1[7].names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ofstream::ofstream(&pCVar1[0xd].var_table);
  *(undefined1 *)&pCVar1[0x12].var_table.table_.max_load_ = 1;
  *(undefined4 *)((long)&pCVar1[0x12].var_table.table_.max_load_ + 4) = 0;
  *(undefined4 *)&pCVar1[0x12].var_table.table_.buckets_ = 0;
  *(undefined1 *)((long)&pCVar1[0x12].var_table.table_.buckets_ + 4) = 0;
  boost::shared_ptr<covenant::TerminalFactory>::shared_ptr
            ((shared_ptr<covenant::TerminalFactory> *)0x1ca735);
  if ((pCVar1[2].var_table.table_.bucket_count_ & 0x100000000) != 0) {
    std::ofstream::open((char *)&pCVar1[2].var_table.table_.max_load_,0x27373e);
    std::ofstream::open((char *)&pCVar1[7].names.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,0x27374e);
    std::ofstream::open((char *)&pCVar1[0xd].var_table,0x27375f);
  }
  return;
}

Assistant:

Solver(CFGProblem problem_, reg_solver_t *s, const Options opts_): 
      problem (problem_), solver (s), opts (opts_), 
      allCfgsReg (true), alphstart (0), alphsz (0),
      hasBeenPreprocessed (false)
  {  
    if (opts.is_dot_enabled)
    {
      refine_log.open("refinements.dot");
      abstract_log.open("abstractions.dot");
      proof_log.open("proof.dot");
    }
  }